

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadFloatArray
          (CrateReader *this,bool is_compressed,vector<float,_std::allocator<float>_> *d)

{
  void *__buf;
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  ssize_t sVar5;
  pointer pfVar6;
  pointer puVar7;
  char *pcVar8;
  size_t sz;
  char code;
  uint32_t shapesize;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  uint32_t n;
  char local_1cd;
  uint local_1cc;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  _Vector_base<float,_std::allocator<float>_> local_1a8 [16];
  
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,&local_1cc);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadFloatArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x21d);
      ::std::operator<<(poVar2," ");
      pcVar8 = "Failed to read the number of array elements.";
      goto LAB_0016e6d0;
    }
    bVar1 = StreamReader::read4(this->_sr,(uint32_t *)local_1a8);
    if (!bVar1) goto LAB_0016e593;
    pfVar6 = (pointer)((ulong)local_1a8[0]._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,(uint64_t *)local_1a8);
    pfVar6 = local_1a8[0]._M_impl.super__Vector_impl_data._M_start;
    if (!bVar1) goto LAB_0016e593;
  }
  if ((pointer)(this->_config).maxArrayElements < pfVar6) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadFloatArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x231);
    ::std::operator<<(poVar2," ");
    pcVar8 = "Too many array elements.";
LAB_0016e6d0:
    poVar2 = ::std::operator<<((ostream *)local_1a8,pcVar8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    return false;
  }
  __buf = (void *)((long)pfVar6 * 4);
  uVar3 = this->_memoryUsage + (long)__buf;
  this->_memoryUsage = uVar3;
  if ((this->_config).maxMemoryBudget < uVar3) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadFloatArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x234);
    ::std::operator<<(poVar2," ");
    pcVar8 = "Reached to max memory budget.";
    goto LAB_0016e6d0;
  }
  ::std::vector<float,_std::allocator<float>_>::resize(d,(size_type)pfVar6);
  if (is_compressed) {
    if ((pointer)0xf < pfVar6) {
      bVar1 = StreamReader::read1(this->_sr,&local_1cd);
      if (bVar1) {
        if (local_1cd == 't') {
          bVar1 = StreamReader::read4(this->_sr,&local_1cc);
          if (bVar1) {
            local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<float,_std::allocator<float>_>::resize
                      ((vector<float,_std::allocator<float>_> *)local_1a8,(ulong)local_1cc);
            sVar5 = StreamReader::read(this->_sr,(int)(void *)((ulong)local_1cc << 2),
                                       (void *)((ulong)local_1cc << 2),
                                       (size_t)local_1a8[0]._M_impl.super__Vector_impl_data._M_start
                                      );
            if (sVar5 == 0) {
              ::std::__cxx11::string::append((char *)&this->_err);
              ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(local_1a8);
              return false;
            }
            local_1c8._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
            local_1c8._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
            local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c8,
                       (size_type)pfVar6);
            bVar1 = ReadCompressedInts<unsigned_int>
                              (this,local_1c8._M_impl.super__Vector_impl_data._M_start,
                               (long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 2);
            if (bVar1) {
              pfVar6 = (d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              for (puVar7 = local_1c8._M_impl.super__Vector_impl_data._M_start;
                  puVar7 != local_1c8._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1
                  ) {
                *pfVar6 = local_1a8[0]._M_impl.super__Vector_impl_data._M_start[*puVar7];
                pfVar6 = pfVar6 + 1;
              }
            }
            else {
              ::std::__cxx11::string::append((char *)&this->_err);
            }
            ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&local_1c8);
            ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(local_1a8);
            goto LAB_0016e99c;
          }
        }
        else if (local_1cd == 'i') {
          local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)local_1a8,(size_type)pfVar6);
          bVar1 = ReadCompressedInts<int>
                            (this,(int *)local_1a8[0]._M_impl.super__Vector_impl_data._M_start,
                             (long)local_1a8[0]._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1a8[0]._M_impl.super__Vector_impl_data._M_start >> 2);
          if (bVar1) {
            ::std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<int*,float*>
                      ((int *)local_1a8[0]._M_impl.super__Vector_impl_data._M_start,
                       (int *)local_1a8[0]._M_impl.super__Vector_impl_data._M_finish,
                       (d->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start);
          }
          else {
            ::std::__cxx11::string::append((char *)&this->_err);
          }
          ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
LAB_0016e99c:
          if (bVar1 == false) {
            return false;
          }
          return true;
        }
      }
      goto LAB_0016e593;
    }
    lVar4 = StreamReader::read(this->_sr,(int)__buf,__buf,
                               (size_t)(d->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    lVar4 = StreamReader::read(this->_sr,(int)__buf,__buf,
                               (size_t)(d->super__Vector_base<float,_std::allocator<float>_>).
                                       _M_impl.super__Vector_impl_data._M_start);
  }
  if (lVar4 != 0) {
    return true;
  }
LAB_0016e593:
  ::std::__cxx11::string::append((char *)&this->_err);
  return false;
}

Assistant:

bool CrateReader::ReadFloatArray(bool is_compressed, std::vector<float> *d) {

  size_t length;
  // < ver 0.7.0  use 32bit
  if (VERSION_LESS_THAN_0_8_0(_version)) {
      uint32_t shapesize; // not used
      if (!_sr->read4(&shapesize)) {
        PUSH_ERROR("Failed to read the number of array elements.");
        return false;
      }
    uint32_t n;
    if (!_sr->read4(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }
    length = size_t(n);
  } else {
    uint64_t n;
    if (!_sr->read8(&n)) {
      _err += "Failed to read the number of array elements.\n";
      return false;
    }

    length = size_t(n);
  }

  if (length > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  CHECK_MEMORY_USAGE(length * sizeof(float));

  d->resize(length);

  if (!is_compressed) {

    // TODO(syoyo): Zero-copy
    if (!_sr->read(sizeof(float) * length, sizeof(float) * length,
                   reinterpret_cast<uint8_t *>(d->data()))) {
      _err += "Failed to read float array data.\n";
      return false;
    }

    return true;
  } else {

    //
    // compressed data is represented by integers or look-up table.
    //

    if (length < crate::kMinCompressedArraySize) {
      size_t sz = sizeof(float) * length;
      // Not stored in compressed.
      // reader.ReadContiguous(odata, osize);
      if (!_sr->read(sz, sz, reinterpret_cast<uint8_t *>(d->data()))) {
        _err += "Failed to read uncompressed array data.\n";
        return false;
      }
      return true;
    }

    // Read the code
    char code;
    if (!_sr->read1(&code)) {
      _err += "Failed to read the code.\n";
      return false;
    }

    if (code == 'i') {
      // Compressed integers.
      std::vector<int32_t> ints;
      ints.resize(length);
      if (!ReadCompressedInts(ints.data(), ints.size())) {
        _err += "Failed to read compressed ints in ReadFloatArray.\n";
        return false;
      }
      std::copy(ints.begin(), ints.end(), d->data());
    } else if (code == 't') {
      // Lookup table & indexes.
      uint32_t lutSize;
      if (!_sr->read4(&lutSize)) {
        _err += "Failed to read lutSize in ReadFloatArray.\n";
        return false;
      }

      std::vector<float> lut;
      lut.resize(lutSize);
      if (!_sr->read(sizeof(float) * lutSize, sizeof(float) * lutSize,
                     reinterpret_cast<uint8_t *>(lut.data()))) {
        _err += "Failed to read lut table in ReadFloatArray.\n";
        return false;
      }

      std::vector<uint32_t> indexes;
      indexes.resize(length);
      if (!ReadCompressedInts(indexes.data(), indexes.size())) {
        _err += "Failed to read lut indices in ReadFloatArray.\n";
        return false;
      }

      auto o = d->data();
      for (auto index : indexes) {
        *o++ = lut[index];
      }
    } else {
      _err += "Invalid code. Data is currupted\n";
      return false;
    }

    return true;
  }

}